

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

void __thiscall crnlib::mip_level::clear(mip_level *this)

{
  undefined4 *in_RDI;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  in_RDI[2] = 0xf;
  in_RDI[3] = 0;
  in_RDI[8] = 0;
  if (*(long *)(in_RDI + 4) != 0) {
    crnlib_delete<crnlib::image<crnlib::color_quad<unsigned_char,int>>>
              ((image<crnlib::color_quad<unsigned_char,_int>_> *)0x1675aa);
    *(undefined8 *)(in_RDI + 4) = 0;
  }
  if (*(long *)(in_RDI + 6) != 0) {
    crnlib_delete<crnlib::dxt_image>((dxt_image *)0x1675d1);
    *(undefined8 *)(in_RDI + 6) = 0;
  }
  return;
}

Assistant:

void mip_level::clear() {
  m_width = 0;
  m_height = 0;
  m_comp_flags = pixel_format_helpers::cDefaultCompFlags;
  m_format = PIXEL_FMT_INVALID;
  m_orient_flags = cDefaultOrientationFlags;

  if (m_pImage) {
    crnlib_delete(m_pImage);
    m_pImage = NULL;
  }

  if (m_pDXTImage) {
    crnlib_delete(m_pDXTImage);
    m_pDXTImage = NULL;
  }
}